

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

void __thiscall
vkt::QueryPool::anon_unknown_0::
QueryPoolStatisticsTest<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsSecondaryTestInstance>
::initPrograms(QueryPoolStatisticsTest<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsSecondaryTestInstance>
               *this,SourceCollections *sourceCollections)

{
  uint uVar1;
  ostream *poVar2;
  size_type sVar3;
  char *pcVar4;
  const_reference pvVar5;
  ProgramSources *this_00;
  string local_388;
  ShaderSource local_368;
  string local_340 [32];
  ostringstream local_320 [8];
  ostringstream src;
  ulong local_1a8;
  size_t shaderNdx;
  ostringstream local_190 [8];
  ostringstream source;
  SourceCollections *sourceCollections_local;
  QueryPoolStatisticsTest<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsSecondaryTestInstance>
  *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_190,"layout(binding = 0) writeonly buffer Output {\n");
  poVar2 = std::operator<<(poVar2,"\tuint values[];\n");
  poVar2 = std::operator<<(poVar2,"} sb_out;\n\n");
  poVar2 = std::operator<<(poVar2,"void main (void) {\n");
  poVar2 = std::operator<<(poVar2,"\tuvec3 indexUvec3 = uvec3 (gl_GlobalInvocationID.x,\n");
  poVar2 = std::operator<<(poVar2,
                           "\t                          gl_GlobalInvocationID.y * gl_NumWorkGroups.x * gl_WorkGroupSize.x,\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "\t                          gl_GlobalInvocationID.z * gl_NumWorkGroups.x * gl_NumWorkGroups.y * gl_WorkGroupSize.x * gl_WorkGroupSize.y);\n"
                          );
  poVar2 = std::operator<<(poVar2,"\tuint index = indexUvec3.x + indexUvec3.y + indexUvec3.z;\n");
  poVar2 = std::operator<<(poVar2,"\tsb_out.values[index] += index;\n");
  std::operator<<(poVar2,"}\n");
  local_1a8 = 0;
  while( true ) {
    sVar3 = std::
            vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
            ::size(&this->m_parameters);
    if (sVar3 <= local_1a8) break;
    std::__cxx11::ostringstream::ostringstream(local_320);
    pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
    poVar2 = std::operator<<((ostream *)local_320,pcVar4);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"layout (local_size_x = ");
    pvVar5 = std::
             vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
             ::operator[](&this->m_parameters,local_1a8);
    uVar1 = tcu::Vector<unsigned_int,_3>::x(&pvVar5->localSize);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
    poVar2 = std::operator<<(poVar2,", local_size_y = ");
    pvVar5 = std::
             vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
             ::operator[](&this->m_parameters,local_1a8);
    uVar1 = tcu::Vector<unsigned_int,_3>::y(&pvVar5->localSize);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
    poVar2 = std::operator<<(poVar2,", local_size_z = ");
    pvVar5 = std::
             vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
             ::operator[](&this->m_parameters,local_1a8);
    uVar1 = tcu::Vector<unsigned_int,_3>::z(&pvVar5->localSize);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
    poVar2 = std::operator<<(poVar2,") in;\n");
    std::__cxx11::ostringstream::str();
    std::operator<<(poVar2,local_340);
    std::__cxx11::string::~string(local_340);
    pvVar5 = std::
             vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
             ::operator[](&this->m_parameters,local_1a8);
    this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                        (&sourceCollections->glslSources,&pvVar5->shaderName);
    std::__cxx11::ostringstream::str();
    glu::ComputeSource::ComputeSource((ComputeSource *)&local_368,&local_388);
    glu::ProgramSources::operator<<(this_00,&local_368);
    glu::ComputeSource::~ComputeSource((ComputeSource *)&local_368);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::ostringstream::~ostringstream(local_320);
    local_1a8 = local_1a8 + 1;
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void initPrograms(SourceCollections& sourceCollections) const
	{
		std::ostringstream	source;
		source	<< "layout(binding = 0) writeonly buffer Output {\n"
				<< "	uint values[];\n"
				<< "} sb_out;\n\n"
				<< "void main (void) {\n"
				<< "	uvec3 indexUvec3 = uvec3 (gl_GlobalInvocationID.x,\n"
				<< "	                          gl_GlobalInvocationID.y * gl_NumWorkGroups.x * gl_WorkGroupSize.x,\n"
				<< "	                          gl_GlobalInvocationID.z * gl_NumWorkGroups.x * gl_NumWorkGroups.y * gl_WorkGroupSize.x * gl_WorkGroupSize.y);\n"
				<< "	uint index = indexUvec3.x + indexUvec3.y + indexUvec3.z;\n"
				<< "	sb_out.values[index] += index;\n"
				<< "}\n";

		for(size_t shaderNdx = 0; shaderNdx < m_parameters.size(); ++shaderNdx)
		{
			std::ostringstream	src;
			src	<< glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450)<<"\n"
				<< "layout (local_size_x = " << m_parameters[shaderNdx].localSize.x() << ", local_size_y = " << m_parameters[shaderNdx].localSize.y() << ", local_size_z = " << m_parameters[shaderNdx].localSize.z() << ") in;\n"
				<< source.str();
			sourceCollections.glslSources.add(m_parameters[shaderNdx].shaderName) << glu::ComputeSource(src.str());
		}
	}